

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run_broker.cpp
# Opt level: O2

int run_broker(switches *opt)

{
  uint *__args_1;
  __shared_ptr<pstore::broker::command_processor,_(__gnu_cxx::_Lock_policy)2> *this;
  bool bVar1;
  int iVar2;
  pointer pfVar3;
  not_null<std::vector<std::future<void>,_std::allocator<std::future<void>_>_>_*> this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  unsigned_short *puVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  size_t __nbytes;
  void *extraout_RDX;
  void *__buf;
  void *extraout_RDX_00;
  uint uVar7;
  pointer this_01;
  pointer pipe_path;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp_5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp_1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Da_03;
  undefined4 extraout_XMM0_Da_04;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  atomic<bool> uptime_done;
  __allocator_type __a2;
  allocator<int> local_2d9;
  packaged_task<void_()> task;
  packaged_task<void_()> task_1;
  packaged_task<void_(pstore::maybe<pstore::http::server_status,_void>_*)> task_4;
  message_ptr msg;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_2a0 [2];
  __allocator_type __a2_2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_288;
  thread quit;
  shared_ptr<pstore::broker::command_processor> commands;
  player playback_file;
  atomic<bool> *local_210;
  shared_ptr<pstore::broker::scavenger> scav;
  shared_ptr<pstore::broker::recorder> record_file;
  vector<std::future<void>,_std::allocator<std::future<void>_>_> futures;
  not_null<std::vector<std::future<void>,_std::allocator<std::future<void>_>_>_*> local_1c0;
  maybe<pstore::http::server_status,_void> http_status;
  __weak_ptr<pstore::broker::scavenger,(__gnu_cxx::_Lock_policy)2> local_170 [8];
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_168;
  __weak_ptr<pstore::broker::command_processor,(__gnu_cxx::_Lock_policy)2> local_160 [8];
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_158;
  not_null<const_char_*> local_150;
  not_null<const_char_*> local_148;
  not_null<const_char_*> local_140;
  not_null<std::atomic<bool>_*> local_138;
  not_null<pstore::maybe<pstore::http::server_status,_void>_*> local_130;
  string local_128;
  not_null<pstore::maybe<pstore::http::server_status,_void>_*> local_108;
  not_null<std::atomic<bool>_*> local_100;
  not_null<pstore::maybe<pstore::http::server_status,_void>_*> local_f8;
  not_null<const_char_*> local_f0;
  not_null<const_char_*> local_e8;
  not_null<const_char_*> local_e0;
  not_null<const_char_*> local_d8;
  update_callback local_d0;
  fifo_path fifo;
  
  local_d8.ptr_ = "main";
  pstore::gsl::not_null<const_char_*>::ensure_invariant(&local_d8);
  pstore::threads::set_name(local_d8);
  std::__cxx11::string::string((string *)&fifo,"broker.main",(allocator *)&playback_file);
  pstore::create_log_stream((string *)&fifo);
  std::__cxx11::string::~string((string *)&fifo);
  local_e0.ptr_ = "broker starting";
  pstore::gsl::not_null<const_char_*>::ensure_invariant(&local_e0);
  pstore::log((pstore *)0x5,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
  record_file.super___shared_ptr<pstore::broker::recorder,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  record_file.super___shared_ptr<pstore::broker::recorder,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if ((opt->record_path).valid_ == true) {
    pstore::
    maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>::
    operator->(&opt->record_path);
    std::make_shared<pstore::broker::recorder,std::__cxx11::string_const&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fifo);
    std::__shared_ptr<pstore::broker::recorder,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&record_file.super___shared_ptr<pstore::broker::recorder,_(__gnu_cxx::_Lock_policy)2>
               ,(__shared_ptr<pstore::broker::recorder,_(__gnu_cxx::_Lock_policy)2> *)&fifo);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&fifo.open_server_pipe_mut_.super___mutex_base._M_mutex + 8));
  }
  local_e8.ptr_ = "opening pipe";
  pstore::gsl::not_null<const_char_*>::ensure_invariant(&local_e8);
  pstore::log((pstore *)0x5,(double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
  if ((opt->pipe_path).valid_ == true) {
    pbVar4 = pstore::
             maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
             ::operator->(&opt->pipe_path);
    pipe_path = (pbVar4->_M_dataplus)._M_p;
  }
  else {
    pipe_path = (czstring)0x0;
  }
  local_d0.super__Function_base._M_functor._8_8_ = 0;
  local_d0.super__Function_base._M_functor._M_unused._M_object =
       pstore::brokerface::fifo_path::default_update_cb;
  local_d0._M_invoker =
       std::
       _Function_handler<void_(pstore::brokerface::fifo_path::operation),_void_(*)(pstore::brokerface::fifo_path::operation)>
       ::_M_invoke;
  local_d0.super__Function_base._M_manager =
       std::
       _Function_handler<void_(pstore::brokerface::fifo_path::operation),_void_(*)(pstore::brokerface::fifo_path::operation)>
       ::_M_manager;
  pstore::brokerface::fifo_path::fifo_path(&fifo,pipe_path,&local_d0);
  std::_Function_base::~_Function_base(&local_d0.super__Function_base);
  futures.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  quit._M_id._M_thread = (id)0;
  futures.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  futures.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if ((opt->http_port).valid_ == true) {
    puVar5 = pstore::maybe<unsigned_short,_void>::operator->(&opt->http_port);
    http_status.valid_ = true;
    http_status.storage_.__align =
         (anon_struct_8_0_00000001_for___align)((ulong)(uint)http_status.storage_._4_4_ << 0x20);
    http_status.storage_._48_2_ = *puVar5;
  }
  else {
    http_status.storage_._48_8_ = 0;
    http_status.valid_ = false;
    http_status._1_7_ = 0;
    http_status.storage_.__align = (anon_struct_8_0_00000001_for___align)0x0;
  }
  http_status.storage_._40_8_ = 0;
  http_status.storage_._32_8_ = 0;
  http_status.storage_._24_8_ = 0;
  http_status.storage_._16_8_ = 0;
  http_status.storage_._8_8_ = 0;
  uptime_done._M_base._M_i = (__atomic_base<bool>)false;
  local_f0.ptr_ = "starting threads";
  pstore::gsl::not_null<const_char_*>::ensure_invariant(&local_f0);
  pstore::log((pstore *)0x5,(double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01));
  __args_1 = &opt->num_read_threads;
  msg._M_t.
  super___uniq_ptr_impl<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>_>
  ._M_t.
  super__Tuple_impl<0UL,_pstore::brokerface::message_type_*,_std::default_delete<pstore::brokerface::message_type>_>
  .super__Head_base<0UL,_pstore::brokerface::message_type_*,_false>._M_head_impl =
       (__uniq_ptr_data<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>,_true,_true>
        )&uptime_done;
  playback_file.mut_.super___mutex_base._M_mutex.__align = (long)&http_status;
  std::
  make_shared<pstore::broker::command_processor,unsigned_int_const&,pstore::maybe<pstore::http::server_status,void>*,std::atomic<bool>*,std::chrono::duration<long,std::ratio<1l,1l>>const&>
            ((uint *)&commands,(maybe<pstore::http::server_status,_void> **)__args_1,
             (atomic<bool> **)&playback_file,(duration<long,_std::ratio<1L,_1L>_> *)&msg);
  std::make_shared<pstore::broker::scavenger,std::shared_ptr<pstore::broker::command_processor>&>
            ((shared_ptr<pstore::broker::command_processor> *)&scav);
  pstore::broker::command_processor::atomic_weak_ptr<pstore::broker::scavenger>::set
            (&(commands.
               super___shared_ptr<pstore::broker::command_processor,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->scavenger_,&scav);
  std::__weak_ptr<pstore::broker::command_processor,(__gnu_cxx::_Lock_policy)2>::
  __weak_ptr<pstore::broker::command_processor,void>
            (local_160,
             &commands.
              super___shared_ptr<pstore::broker::command_processor,_(__gnu_cxx::_Lock_policy)2>);
  std::__weak_ptr<pstore::broker::scavenger,(__gnu_cxx::_Lock_policy)2>::
  __weak_ptr<pstore::broker::scavenger,void>
            (local_170,
             &scav.super___shared_ptr<pstore::broker::scavenger,_(__gnu_cxx::_Lock_policy)2>);
  uVar7 = *__args_1;
  local_f8.ptr_ = &http_status;
  pstore::gsl::not_null<pstore::maybe<pstore::http::server_status,_void>_*>::ensure_invariant
            (&local_f8);
  local_100.ptr_ = &uptime_done;
  pstore::gsl::not_null<std::atomic<bool>_*>::ensure_invariant(&local_100);
  __nbytes = (size_t)uVar7;
  pstore::broker::create_quit_thread
            ((broker *)&playback_file,(weak_ptr<pstore::broker::command_processor> *)local_160,
             (weak_ptr<pstore::broker::scavenger> *)local_170,uVar7,local_f8,local_100);
  if (quit._M_id._M_thread == 0) {
    quit._M_id._M_thread = (id)(id)playback_file.mut_.super___mutex_base._M_mutex.__align;
    playback_file.mut_.super___mutex_base._M_mutex.__align = 0;
    std::thread::~thread((thread *)&playback_file);
    std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&local_168);
    std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&local_158);
    local_210 = &uptime_done;
    a_Stack_2a0[1]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    msg._M_t.
    super___uniq_ptr_impl<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>_>
    ._M_t.
    super__Tuple_impl<0UL,_pstore::brokerface::message_type_*,_std::default_delete<pstore::brokerface::message_type>_>
    .super__Head_base<0UL,_pstore::brokerface::message_type_*,_false>._M_head_impl =
         (__uniq_ptr_data<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>,_true,_true>
          )(__uniq_ptr_impl<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>_>
            )0x0;
    a_Stack_2a0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    playback_file.mut_.super___mutex_base._M_mutex.__align = (long)&fifo;
    this = (__shared_ptr<pstore::broker::command_processor,_(__gnu_cxx::_Lock_policy)2> *)
           ((long)&playback_file.mut_.super___mutex_base._M_mutex + 8);
    std::__shared_ptr<pstore::broker::command_processor,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (this,&commands.
                     super___shared_ptr<pstore::broker::command_processor,_(__gnu_cxx::_Lock_policy)2>
              );
    p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x50);
    p_Var6->_M_use_count = 1;
    p_Var6->_M_weak_count = 1;
    p_Var6->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00158da0;
    task_4._M_state.
    super___shared_ptr<std::__future_base::_Task_state_base<void_(pstore::maybe<pstore::http::server_status,_void>_*)>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)&__a2;
    task_4._M_state.
    super___shared_ptr<std::__future_base::_Task_state_base<void_(pstore::maybe<pstore::http::server_status,_void>_*)>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = p_Var6;
    std::__future_base::_Task_state_base<void()>::_Task_state_base<std::allocator<int>>
              ((_Task_state_base<void()> *)(p_Var6 + 1),&local_2d9);
    p_Var6[1]._vptr__Sp_counted_base = (_func_int **)&PTR___Task_state_00158df0;
    p_Var6[3]._M_use_count = playback_file.mut_.super___mutex_base._M_mutex.__align._0_4_;
    p_Var6[3]._M_weak_count = playback_file.mut_.super___mutex_base._M_mutex._4_4_;
    std::__shared_ptr<pstore::broker::command_processor,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<pstore::broker::command_processor,_(__gnu_cxx::_Lock_policy)2> *)
               (p_Var6 + 4),this);
    task_4._M_state.
    super___shared_ptr<std::__future_base::_Task_state_base<void_(pstore::maybe<pstore::http::server_status,_void>_*)>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::
    __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Task_state<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/tools/brokerd/run_broker.cpp:121:43),_std::allocator<int>,_void_()>,_std::allocator<int>,_(__gnu_cxx::_Lock_policy)2>_>_>
    ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Task_state<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_tools_brokerd_run_broker_cpp:121:43),_std::allocator<int>,_void_()>,_std::allocator<int>,_(__gnu_cxx::_Lock_policy)2>_>_>
                        *)&task_4);
    task_1._M_state.
    super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    task_1._M_state.
    super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    task._M_state.
    super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)(p_Var6 + 1);
    task._M_state.
    super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = p_Var6;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&task_1._M_state.
                super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    std::packaged_task<void_()>::get_future((packaged_task<void_()> *)&__a2_2);
    std::thread::thread<std::packaged_task<void()>,,void>((thread *)&task_4,&task);
    std::thread::detach();
    std::thread::~thread((thread *)&task_4);
    std::packaged_task<void_()>::~packaged_task(&task);
    std::vector<std::future<void>,std::allocator<std::future<void>>>::
    emplace_back<std::future<void>>
              ((vector<std::future<void>,std::allocator<std::future<void>>> *)&msg,
               (future<void> *)&__a2_2);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_288);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&playback_file.mut_.super___mutex_base._M_mutex + 0x10));
    std::__shared_ptr<pstore::broker::scavenger,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<pstore::broker::scavenger,_(__gnu_cxx::_Lock_policy)2> *)&__a2_2,
               &scav.super___shared_ptr<pstore::broker::scavenger,_(__gnu_cxx::_Lock_policy)2>);
    p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x48);
    p_Var6->_M_use_count = 1;
    p_Var6->_M_weak_count = 1;
    p_Var6->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00158e70;
    playback_file.mut_.super___mutex_base._M_mutex.__align = (long)(element_type *)&__a2;
    playback_file.mut_.super___mutex_base._M_mutex._8_8_ = p_Var6;
    std::__future_base::_Task_state_base<void()>::_Task_state_base<std::allocator<int>>
              ((_Task_state_base<void()> *)(p_Var6 + 1),&local_2d9);
    p_Var6[1]._vptr__Sp_counted_base = (_func_int **)&PTR___Task_state_00158ec0;
    std::__shared_ptr<pstore::broker::scavenger,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<pstore::broker::scavenger,_(__gnu_cxx::_Lock_policy)2> *)
               &p_Var6[3]._M_use_count,
               (__shared_ptr<pstore::broker::scavenger,_(__gnu_cxx::_Lock_policy)2> *)&__a2_2);
    playback_file.mut_.super___mutex_base._M_mutex._8_8_ = 0;
    std::
    __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Task_state<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/tools/brokerd/run_broker.cpp:126:43),_std::allocator<int>,_void_()>,_std::allocator<int>,_(__gnu_cxx::_Lock_policy)2>_>_>
    ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Task_state<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_tools_brokerd_run_broker_cpp:126:43),_std::allocator<int>,_void_()>,_std::allocator<int>,_(__gnu_cxx::_Lock_policy)2>_>_>
                        *)&playback_file);
    task_4._M_state.
    super___shared_ptr<std::__future_base::_Task_state_base<void_(pstore::maybe<pstore::http::server_status,_void>_*)>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    task_4._M_state.
    super___shared_ptr<std::__future_base::_Task_state_base<void_(pstore::maybe<pstore::http::server_status,_void>_*)>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    task_1._M_state.
    super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)(p_Var6 + 1);
    task_1._M_state.
    super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = p_Var6;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&task_4._M_state.
                super___shared_ptr<std::__future_base::_Task_state_base<void_(pstore::maybe<pstore::http::server_status,_void>_*)>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    std::packaged_task<void_()>::get_future(&task);
    std::thread::thread<std::packaged_task<void()>,,void>((thread *)&playback_file,&task_1);
    std::thread::detach();
    std::thread::~thread((thread *)&playback_file);
    std::packaged_task<void_()>::~packaged_task(&task_1);
    std::vector<std::future<void>,std::allocator<std::future<void>>>::
    emplace_back<std::future<void>>
              ((vector<std::future<void>,std::allocator<std::future<void>>> *)&msg,
               (future<void> *)&task);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&task._M_state.
                super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_288);
    p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x40);
    playback_file.mut_.super___mutex_base._M_mutex.__align = (long)&__a2_2;
    p_Var6->_M_use_count = 1;
    p_Var6->_M_weak_count = 1;
    p_Var6->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00158f40;
    playback_file.mut_.super___mutex_base._M_mutex._8_8_ = p_Var6;
    std::__future_base::_Task_state_base<void()>::_Task_state_base<std::allocator<int>>
              ((_Task_state_base<void()> *)(p_Var6 + 1),(allocator<int> *)&__a2);
    p_Var6[1]._vptr__Sp_counted_base = (_func_int **)&PTR___Task_state_00158f90;
    playback_file.mut_.super___mutex_base._M_mutex._8_8_ = 0;
    std::
    __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Task_state<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/tools/brokerd/run_broker.cpp:131:43),_std::allocator<int>,_void_()>,_std::allocator<int>,_(__gnu_cxx::_Lock_policy)2>_>_>
    ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Task_state<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_tools_brokerd_run_broker_cpp:131:43),_std::allocator<int>,_void_()>,_std::allocator<int>,_(__gnu_cxx::_Lock_policy)2>_>_>
                        *)&playback_file);
    task_4._M_state.
    super___shared_ptr<std::__future_base::_Task_state_base<void_(pstore::maybe<pstore::http::server_status,_void>_*)>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    task_4._M_state.
    super___shared_ptr<std::__future_base::_Task_state_base<void_(pstore::maybe<pstore::http::server_status,_void>_*)>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    task_1._M_state.
    super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)(p_Var6 + 1);
    task_1._M_state.
    super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = p_Var6;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&task_4._M_state.
                super___shared_ptr<std::__future_base::_Task_state_base<void_(pstore::maybe<pstore::http::server_status,_void>_*)>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    std::packaged_task<void_()>::get_future(&task);
    std::thread::thread<std::packaged_task<void()>,,void>((thread *)&playback_file,&task_1);
    std::thread::detach();
    std::thread::~thread((thread *)&playback_file);
    std::packaged_task<void_()>::~packaged_task(&task_1);
    std::vector<std::future<void>,std::allocator<std::future<void>>>::
    emplace_back<std::future<void>>
              ((vector<std::future<void>,std::allocator<std::future<void>>> *)&msg,
               (future<void> *)&task);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&task._M_state.
                super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x40);
    playback_file.mut_.super___mutex_base._M_mutex.__align = (long)&__a2_2;
    p_Var6->_M_use_count = 1;
    p_Var6->_M_weak_count = 1;
    p_Var6->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00159010;
    playback_file.mut_.super___mutex_base._M_mutex._8_8_ = p_Var6;
    std::__future_base::_Task_state_base<void(std::atomic<bool>*const&)>::
    _Task_state_base<std::allocator<int>>
              ((_Task_state_base<void(std::atomic<bool>*const&)> *)(p_Var6 + 1),
               (allocator<int> *)&__a2);
    p_Var6[1]._vptr__Sp_counted_base = (_func_int **)&PTR___Task_state_00159060;
    playback_file.mut_.super___mutex_base._M_mutex._8_8_ = 0;
    std::
    __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Task_state<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/tools/brokerd/run_broker.cpp:137:13),_std::allocator<int>,_void_(std::atomic<bool>_*const_&)>,_std::allocator<int>,_(__gnu_cxx::_Lock_policy)2>_>_>
    ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Task_state<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_tools_brokerd_run_broker_cpp:137:13),_std::allocator<int>,_void_(std::atomic<bool>_*const_&)>,_std::allocator<int>,_(__gnu_cxx::_Lock_policy)2>_>_>
                        *)&playback_file);
    task_4._M_state.
    super___shared_ptr<std::__future_base::_Task_state_base<void_(pstore::maybe<pstore::http::server_status,_void>_*)>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    task_4._M_state.
    super___shared_ptr<std::__future_base::_Task_state_base<void_(pstore::maybe<pstore::http::server_status,_void>_*)>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    task_1._M_state.
    super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)(p_Var6 + 1);
    task_1._M_state.
    super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = p_Var6;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&task_4._M_state.
                super___shared_ptr<std::__future_base::_Task_state_base<void_(pstore::maybe<pstore::http::server_status,_void>_*)>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    std::packaged_task<void_(std::atomic<bool>_*const_&)>::get_future
              ((packaged_task<void_(std::atomic<bool>_*const_&)> *)&task);
    std::thread::
    thread<std::packaged_task<void(std::atomic<bool>*const&)>,std::atomic<bool>*const&,void>
              ((thread *)&playback_file,(packaged_task<void_(std::atomic<bool>_*const_&)> *)&task_1,
               &local_210);
    std::thread::detach();
    std::thread::~thread((thread *)&playback_file);
    std::packaged_task<void_(std::atomic<bool>_*const_&)>::~packaged_task
              ((packaged_task<void_(std::atomic<bool>_*const_&)> *)&task_1);
    std::vector<std::future<void>,std::allocator<std::future<void>>>::
    emplace_back<std::future<void>>
              ((vector<std::future<void>,std::allocator<std::future<void>>> *)&msg,
               (future<void> *)&task);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&task._M_state.
                super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    std::vector<std::future<void>,_std::allocator<std::future<void>_>_>::_M_move_assign
              (&futures,(vector<std::future<void>,_std::allocator<std::future<void>_>_> *)&msg);
    std::vector<std::future<void>,_std::allocator<std::future<void>_>_>::~vector
              ((vector<std::future<void>,_std::allocator<std::future<void>_>_> *)&msg);
    local_1c0.ptr_ = (vector<std::future<void>,_std::allocator<std::future<void>_>_> *)&futures;
    pstore::gsl::not_null<std::vector<std::future<void>,_std::allocator<std::future<void>_>_>_*>::
    ensure_invariant(&local_1c0);
    local_108.ptr_ = &http_status;
    pstore::gsl::not_null<pstore::maybe<pstore::http::server_status,_void>_*>::ensure_invariant
              (&local_108);
    this_00.ptr_ = local_1c0.ptr_;
    if ((local_108.ptr_)->valid_ == true) {
      bVar1 = opt->announce_http_port;
      task._M_state.
      super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)local_108.ptr_;
      p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x40);
      playback_file.mut_.super___mutex_base._M_mutex.__align = (long)&__a2_2;
      p_Var6->_M_use_count = 1;
      p_Var6->_M_weak_count = 1;
      p_Var6->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001590e0;
      playback_file.mut_.super___mutex_base._M_mutex._8_8_ = p_Var6;
      std::__future_base::_Task_state_base<void(pstore::maybe<pstore::http::server_status,void>*)>::
      _Task_state_base<std::allocator<int>>
                ((_Task_state_base<void(pstore::maybe<pstore::http::server_status,void>*)> *)
                 (p_Var6 + 1),(allocator<int> *)&local_210);
      p_Var6[1]._vptr__Sp_counted_base = (_func_int **)&PTR___Task_state_00159130;
      *(bool *)&p_Var6[3]._M_use_count = bVar1;
      playback_file.mut_.super___mutex_base._M_mutex._8_8_ = 0;
      std::
      __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Task_state<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/tools/brokerd/run_broker.cpp:91:13),_std::allocator<int>,_void_(pstore::maybe<pstore::http::server_status,_void>_*)>,_std::allocator<int>,_(__gnu_cxx::_Lock_policy)2>_>_>
      ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Task_state<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_tools_brokerd_run_broker_cpp:91:13),_std::allocator<int>,_void_(pstore::maybe<pstore::http::server_status,_void>_*)>,_std::allocator<int>,_(__gnu_cxx::_Lock_policy)2>_>_>
                          *)&playback_file);
      msg._M_t.
      super___uniq_ptr_impl<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>_>
      ._M_t.
      super__Tuple_impl<0UL,_pstore::brokerface::message_type_*,_std::default_delete<pstore::brokerface::message_type>_>
      .super__Head_base<0UL,_pstore::brokerface::message_type_*,_false>._M_head_impl =
           (__uniq_ptr_data<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>,_true,_true>
            )(__uniq_ptr_impl<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>_>
              )0x0;
      a_Stack_2a0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      task_4._M_state.
      super___shared_ptr<std::__future_base::_Task_state_base<void_(pstore::maybe<pstore::http::server_status,_void>_*)>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)(p_Var6 + 1);
      task_4._M_state.
      super___shared_ptr<std::__future_base::_Task_state_base<void_(pstore::maybe<pstore::http::server_status,_void>_*)>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = p_Var6;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_2a0);
      std::packaged_task<void_(pstore::maybe<pstore::http::server_status,_void>_*)>::get_future
                ((packaged_task<void_(pstore::maybe<pstore::http::server_status,_void>_*)> *)&task_1
                );
      std::thread::
      thread<std::packaged_task<void(pstore::maybe<pstore::http::server_status,void>*)>,pstore::maybe<pstore::http::server_status,void>*,void>
                ((thread *)&playback_file,&task_4,(maybe<pstore::http::server_status,_void> **)&task
                );
      std::thread::detach();
      std::thread::~thread((thread *)&playback_file);
      std::packaged_task<void_(pstore::maybe<pstore::http::server_status,_void>_*)>::~packaged_task
                (&task_4);
      std::vector<std::future<void>,std::allocator<std::future<void>>>::
      emplace_back<std::future<void>>
                ((vector<std::future<void>,std::allocator<std::future<void>>> *)this_00.ptr_,
                 (future<void> *)&task_1);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&task_1._M_state.
                  super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
    }
    if ((opt->playback_path).valid_ == false) {
      for (uVar7 = 0; uVar7 < *__args_1; uVar7 = uVar7 + 1) {
        playback_file.mut_.super___mutex_base._M_mutex.__data.__lock = uVar7;
        playback_file.mut_.super___mutex_base._M_mutex._8_8_ = &fifo;
        playback_file.mut_.super___mutex_base._M_mutex._16_8_ = &record_file;
        std::__shared_ptr<pstore::broker::command_processor,_(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr((__shared_ptr<pstore::broker::command_processor,_(__gnu_cxx::_Lock_policy)2> *)
                     &playback_file.mut_.super___mutex_base._M_mutex.__data.__list,
                     &commands.
                      super___shared_ptr<pstore::broker::command_processor,_(__gnu_cxx::_Lock_policy)2>
                    );
        p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x60);
        msg._M_t.
        super___uniq_ptr_impl<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>_>
        ._M_t.
        super__Tuple_impl<0UL,_pstore::brokerface::message_type_*,_std::default_delete<pstore::brokerface::message_type>_>
        .super__Head_base<0UL,_pstore::brokerface::message_type_*,_false>._M_head_impl =
             (__uniq_ptr_data<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>,_true,_true>
              )&__a2_2;
        p_Var6->_M_use_count = 1;
        p_Var6->_M_weak_count = 1;
        p_Var6->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001591c0;
        a_Stack_2a0[0]._M_pi = p_Var6;
        std::__future_base::_Task_state_base<void()>::_Task_state_base<std::allocator<int>>
                  ((_Task_state_base<void()> *)(p_Var6 + 1),(allocator<int> *)&local_210);
        p_Var6[1]._vptr__Sp_counted_base = (_func_int **)&PTR___Task_state_00159210;
        p_Var6[3]._M_use_count = playback_file.mut_.super___mutex_base._M_mutex.__align._0_4_;
        p_Var6[3]._M_weak_count = playback_file.mut_.super___mutex_base._M_mutex._4_4_;
        p_Var6[4]._vptr__Sp_counted_base =
             (_func_int **)playback_file.mut_.super___mutex_base._M_mutex._8_8_;
        p_Var6[4]._M_use_count = playback_file.mut_.super___mutex_base._M_mutex._16_4_;
        p_Var6[4]._M_weak_count = playback_file.mut_.super___mutex_base._M_mutex._20_4_;
        std::__shared_ptr<pstore::broker::command_processor,_(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr((__shared_ptr<pstore::broker::command_processor,_(__gnu_cxx::_Lock_policy)2> *)
                     (p_Var6 + 5),
                     (__shared_ptr<pstore::broker::command_processor,_(__gnu_cxx::_Lock_policy)2> *)
                     &playback_file.mut_.super___mutex_base._M_mutex.__data.__list);
        a_Stack_2a0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        std::
        __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Task_state<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/tools/brokerd/run_broker.cpp:220:51),_std::allocator<int>,_void_()>,_std::allocator<int>,_(__gnu_cxx::_Lock_policy)2>_>_>
        ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Task_state<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_tools_brokerd_run_broker_cpp:220:51),_std::allocator<int>,_void_()>,_std::allocator<int>,_(__gnu_cxx::_Lock_policy)2>_>_>
                            *)&msg);
        task_4._M_state.
        super___shared_ptr<std::__future_base::_Task_state_base<void_(pstore::maybe<pstore::http::server_status,_void>_*)>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x0;
        task_4._M_state.
        super___shared_ptr<std::__future_base::_Task_state_base<void_(pstore::maybe<pstore::http::server_status,_void>_*)>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        task_1._M_state.
        super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)(p_Var6 + 1);
        task_1._M_state.
        super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = p_Var6;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&task_4._M_state.
                    super___shared_ptr<std::__future_base::_Task_state_base<void_(pstore::maybe<pstore::http::server_status,_void>_*)>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
        std::packaged_task<void_()>::get_future(&task);
        std::thread::thread<std::packaged_task<void()>,,void>((thread *)&msg,&task_1);
        std::thread::detach();
        std::thread::~thread((thread *)&msg);
        std::packaged_task<void_()>::~packaged_task(&task_1);
        std::vector<std::future<void>,std::allocator<std::future<void>>>::
        emplace_back<std::future<void>>
                  ((vector<std::future<void>,std::allocator<std::future<void>>> *)&futures,
                   (future<void> *)&task);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&task._M_state.
                    super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &playback_file.mut_.super___mutex_base._M_mutex.__data.__list.__next);
      }
    }
    else {
      pbVar4 = pstore::
               maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
               ::operator->(&opt->playback_path);
      std::__cxx11::string::string((string *)&local_128,(string *)pbVar4);
      pstore::broker::player::player(&playback_file,&local_128);
      std::__cxx11::string::~string((string *)&local_128);
      __buf = extraout_RDX;
      while( true ) {
        pstore::broker::player::read((player *)&msg,(int)&playback_file,__buf,__nbytes);
        if ((__uniq_ptr_impl<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>_>
             )msg._M_t.
              super___uniq_ptr_impl<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>_>
              ._M_t.
              super__Tuple_impl<0UL,_pstore::brokerface::message_type_*,_std::default_delete<pstore::brokerface::message_type>_>
              .super__Head_base<0UL,_pstore::brokerface::message_type_*,_false>._M_head_impl ==
            (__uniq_ptr_impl<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>_>
             )0x0) break;
        pstore::broker::command_processor::push_command
                  (commands.
                   super___shared_ptr<pstore::broker::command_processor,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr,&msg,
                   record_file.
                   super___shared_ptr<pstore::broker::recorder,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        std::
        unique_ptr<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>_>
        ::~unique_ptr((unique_ptr<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>_>
                       *)&msg);
        __buf = extraout_RDX_00;
      }
      std::
      unique_ptr<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>_>
      ::~unique_ptr(&msg);
      local_130.ptr_ = &http_status;
      pstore::gsl::not_null<pstore::maybe<pstore::http::server_status,_void>_*>::ensure_invariant
                (&local_130);
      local_138.ptr_ = &uptime_done;
      pstore::gsl::not_null<std::atomic<bool>_*>::ensure_invariant(&local_138);
      pstore::broker::shutdown
                ((int)commands.
                      super___shared_ptr<pstore::broker::command_processor,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr,
                 (int)scav.super___shared_ptr<pstore::broker::scavenger,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr);
      pstore::broker::player::~player(&playback_file);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&scav.super___shared_ptr<pstore::broker::scavenger,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&commands.
                super___shared_ptr<pstore::broker::command_processor,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    local_140.ptr_ = "waiting";
    pstore::gsl::not_null<const_char_*>::ensure_invariant(&local_140);
    pstore::log((pstore *)0x5,(double)CONCAT44(extraout_XMM0_Db_02,extraout_XMM0_Da_02));
    pfVar3 = futures.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    this_01 = futures.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
    while( true ) {
      if (this_01 == pfVar3) {
        local_148.ptr_ = "worker threads done: stopping quit thread";
        pstore::gsl::not_null<const_char_*>::ensure_invariant(&local_148);
        pstore::log((pstore *)0x5,(double)CONCAT44(extraout_XMM0_Db_03,extraout_XMM0_Da_03));
        pstore::broker::notify_quit_thread();
        std::thread::join();
        local_150.ptr_ = "exiting";
        pstore::gsl::not_null<const_char_*>::ensure_invariant(&local_150);
        pstore::log((pstore *)0x5,(double)CONCAT44(extraout_XMM0_Db_04,extraout_XMM0_Da_04));
        iVar2 = pstore::broker::exit_code;
        std::thread::~thread(&quit);
        std::vector<std::future<void>,_std::allocator<std::future<void>_>_>::~vector(&futures);
        pstore::brokerface::fifo_path::~fifo_path(&fifo);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&record_file.
                    super___shared_ptr<pstore::broker::recorder,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        return iVar2;
      }
      if ((this_01->super___basic_future<void>)._M_state.
          super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          == (element_type *)0x0) break;
      std::future<void>::get(this_01);
      this_01 = this_01 + 1;
    }
    pstore::assert_failed
              ("f.valid ()",
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/tools/brokerd/run_broker.cpp"
               ,0xe8);
  }
  std::terminate();
}

Assistant:

int run_broker (switches const & opt) {
    using priority = logger::priority;

    threads::set_name ("main");
    create_log_stream ("broker.main");
    log (priority::notice, "broker starting");

#ifdef _WIN32
    wsa_startup startup;
    if (!startup.started ()) {
        throw std::runtime_error ("WSAStartup() failed, broker exited");
    }
#endif // _WIN32

    // If we're recording the messages we receive, then create the file in which they
    // will be stored.
    std::shared_ptr<broker::recorder> record_file;
    if (opt.record_path.has_value ()) {
        record_file = std::make_shared<broker::recorder> (*opt.record_path);
    }

    // TODO: ensure that this is a singleton process?
    log (priority::notice, "opening pipe");

    brokerface::fifo_path fifo{opt.pipe_path.has_value () ? opt.pipe_path->c_str () : nullptr};

    std::vector<std::future<void>> futures;
    std::thread quit;

    maybe<http::server_status> http_status = get_http_server_status (opt.http_port);
    std::atomic<bool> uptime_done{false};

    log (priority::notice, "starting threads");
    {
        auto commands = std::make_shared<broker::command_processor> (
            opt.num_read_threads, &http_status, &uptime_done, opt.scavenge_time);
        auto scav = std::make_shared<broker::scavenger> (commands);
        commands->attach_scavenger (scav);

        quit = create_quit_thread (make_weak (commands), make_weak (scav), opt.num_read_threads,
                                   &http_status, &uptime_done);

        futures = create_worker_threads (commands, fifo, scav, &uptime_done);
        create_http_worker_thread (&futures, &http_status, opt.announce_http_port);

        if (opt.playback_path.has_value ()) {
            broker::player playback_file (*opt.playback_path);
            while (auto msg = playback_file.read ()) {
                commands->push_command (std::move (msg), record_file.get ());
            }
            shutdown (commands.get (), scav.get (), -1 /*signum*/, 0U /*num read threads*/,
                      &http_status, &uptime_done);
        } else {
            for (auto ctr = 0U; ctr < opt.num_read_threads; ++ctr) {
                futures.push_back (create_thread ([ctr, &fifo, &record_file, commands] () {
                    auto const name = "read"s + std::to_string (ctr);
                    threads::set_name (name.c_str ());
                    create_log_stream ("broker." + name);
                    read_loop (fifo, record_file, commands);
                }));
            }
        }
    }

    log (priority::notice, "waiting");
    for (auto & f : futures) {
        PSTORE_ASSERT (f.valid ());
        f.get ();
    }
    log (priority::notice, "worker threads done: stopping quit thread");
    broker::notify_quit_thread ();
    quit.join ();
    log (priority::notice, "exiting");
    return broker::exit_code;
}